

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IColourImpl * Catch::anon_unknown_1::platformColourInstance(void)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  long *plVar3;
  undefined **ppuVar4;
  undefined1 *puVar5;
  ErrnoGuard guard;
  ErrnoGuard local_1c;
  
  ErrnoGuard::ErrnoGuard(&local_1c);
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar4 = &PTR__Context_001cbaf0;
    *IMutableContext::currentContext = &PTR__Context_001cbaf0;
    IMutableContext::currentContext[1] = &PTR__Context_001cbb40;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar4 = (undefined **)*IMutableContext::currentContext;
  }
  plVar3 = (long *)(*(code *)ppuVar4[4])();
  plVar1 = (long *)*plVar3;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if (plVar1 == (long *)0x0) {
LAB_00167164:
    iVar2 = isatty(1);
    if (iVar2 != 0) goto LAB_00167172;
LAB_00167185:
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') {
      ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_00167196;
    }
    puVar5 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
    ppuVar4 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar2 = (**(code **)(*plVar1 + 0x90))();
    if (iVar2 != 1) {
      if (iVar2 == 0) goto LAB_00167164;
      goto LAB_00167185;
    }
LAB_00167172:
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance != '\0') {
      ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      goto LAB_00167196;
    }
    puVar5 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    ppuVar4 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  if (iVar2 != 0) {
    __cxa_guard_release(puVar5);
  }
LAB_00167196:
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  ErrnoGuard::~ErrnoGuard(&local_1c);
  return (IColourImpl *)ppuVar4;
}

Assistant:

IColourImpl* platformColourInstance() {
        ErrnoGuard guard;
        IConfigPtr config = getCurrentContext().getConfig();
        UseColour::YesOrNo colourMode = config
            ? config->useColour()
            : UseColour::Auto;
        if( colourMode == UseColour::Auto )
            colourMode = useColourOnPlatform()
                ? UseColour::Yes
                : UseColour::No;
        return colourMode == UseColour::Yes
            ? PosixColourImpl::instance()
            : NoColourImpl::instance();
    }